

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Events.c
# Opt level: O3

void character_bed_vischar(tgestate_t *state,route_t *route)

{
  uint8_t *puVar1;
  byte bVar2;
  routeindex_t rVar3;
  
  bVar2 = state->IY->character;
  if (bVar2 != 0) {
    route->step = '\0';
    if (bVar2 < 0x14) {
      rVar3 = '\r';
      if ((bVar2 & 1) != 0) {
        route->step = '\x01';
        rVar3 = 0x8d;
      }
    }
    else {
      rVar3 = bVar2 - 0xd;
    }
    route->index = rVar3;
    return;
  }
  if (state->in_solitary != '\0') {
    return;
  }
  puVar1 = &state->vischars[0].flags;
  *puVar1 = *puVar1 & 0xbf;
  state->vischars[0].route.index = ',';
  state->vischars[0].route.step = '\0';
  set_route(state,state->vischars);
  return;
}

Assistant:

void character_bed_vischar(tgestate_t *state, route_t *route)
{
  character_t character;
  vischar_t  *vischar;

  assert(state != NULL);
  assert(route != NULL);
  ASSERT_ROUTE_VALID(*route);

  vischar = state->IY;
  ASSERT_VISCHAR_VALID(vischar);

  character = vischar->character;
  if (character == character_0_COMMANDANT)
  {
    // Hero moves to bed in reaction to the commandant...

    static const route_t t = { routeindex_44_HUT2_RIGHT_TO_LEFT, 0 }; /* was BC */
    set_hero_route(state, &t);
  }
  else
  {
    character_bed_common(state, character, route); /* was fallthrough */
  }
}